

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::module::add_object(module *this,char *name,object *obj,bool overwrite)

{
  PyObject *pPVar1;
  bool bVar2;
  undefined3 in_register_00000009;
  allocator local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (CONCAT31(in_register_00000009,overwrite) == 0) {
    bVar2 = hasattr((this->super_object).super_handle.m_ptr,name);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_38,name,&local_79);
      std::operator+(&local_78,
                     "Error during initialization: multiple incompatible definitions with name \"",
                     &local_38);
      std::operator+(&local_58,&local_78,"\"");
      pybind11_fail(&local_58);
    }
  }
  pPVar1 = (obj->super_handle).m_ptr;
  if (pPVar1 != (PyObject *)0x0) {
    pPVar1->ob_refcnt = pPVar1->ob_refcnt + 1;
  }
  PyModule_AddObject((this->super_object).super_handle.m_ptr,name);
  return;
}

Assistant:

PYBIND11_NOINLINE void add_object(const char *name, object &obj, bool overwrite = false) {
        if (!overwrite && hasattr(*this, name))
            pybind11_fail("Error during initialization: multiple incompatible definitions with name \"" +
                    std::string(name) + "\"");

        obj.inc_ref(); // PyModule_AddObject() steals a reference
        PyModule_AddObject(ptr(), name, obj.ptr());
    }